

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

Promise<void> __thiscall kj::UnixEventPort::FdObserver::whenBecomesWritable(FdObserver *this)

{
  SourceLocation location;
  bool bVar1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *t;
  Promise<void> *pPVar2;
  long in_RSI;
  undefined8 in_stack_ffffffffffffff50;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *this_00;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_90;
  SourceLocation local_78;
  undefined1 local_60 [8];
  PromiseFulfillerPair<void> paf;
  Fault local_38;
  Fault f;
  uint *local_28;
  DebugExpression<unsigned_int> local_1c [2];
  DebugExpression<unsigned_int> _kjCondition;
  FdObserver *this_local;
  
  local_28 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)(in_RSI + 0xc))
  ;
  f.exception._4_4_ = 2;
  local_1c[0] = kj::_::DebugExpression<unsigned_int&>::operator&
                          ((DebugExpression<unsigned_int&> *)&local_28,
                           (Flags *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)local_1c);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<unsigned_int>&,char_const(&)[42]>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x202,FAILED,"flags & OBSERVE_WRITE",
               "_kjCondition,\"FdObserver was not set to observe writes.\"",local_1c,
               (char (*) [42])"FdObserver was not set to observe writes.");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  SourceLocation::SourceLocation
            (&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
             ,"whenBecomesWritable",0x204,0xe);
  location.function = (char *)local_78._16_8_;
  location.fileName = local_78.function;
  location.lineNumber = (int)in_stack_ffffffffffffff50;
  location.columnNumber = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  newPromiseAndFulfiller<void>(location);
  t = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
  this_00 = &local_90;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(this_00,t);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
            ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0x20),this_00)
  ;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_90);
  pPVar2 = mv<kj::Promise<void>>((Promise<void> *)local_60);
  Promise<void>::Promise((Promise<void> *)this,pPVar2);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_60);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> UnixEventPort::FdObserver::whenBecomesWritable() {
  KJ_REQUIRE(flags & OBSERVE_WRITE, "FdObserver was not set to observe writes.");

  auto paf = newPromiseAndFulfiller<void>();
  writeFulfiller = kj::mv(paf.fulfiller);
  return kj::mv(paf.promise);
}